

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O3

uint64_t __thiscall FileReader::getpos(FileReader *this)

{
  uint64_t uVar1;
  
  uVar1 = ftello((FILE *)this->_f);
  return uVar1;
}

Assistant:

virtual uint64_t getpos() const
    {
#ifdef _WIN32_WCE
        return ftell(_f);
#elif defined(_WIN32)
        return _ftelli64(_f);
#else
        return ftello(_f);
#endif
    }